

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Fraction * __thiscall Matrix::At(Matrix *this,int i,int j)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int extraout_EDX;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  
  uVar5 = (ulong)i;
  pvVar1 = (this->elements_).
           super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->elements_).
                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar6 = uVar5;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    uVar6 = (ulong)j;
    lVar2 = *(long *)&pvVar1[uVar5].super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                      super__Vector_impl_data;
    uVar4 = (long)*(pointer *)
                   ((long)&pvVar1[uVar5].super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                           _M_impl.super__Vector_impl_data + 8) - lVar2 >> 3;
    if (uVar6 < uVar4) {
      return (Fraction *)(lVar2 + uVar6 * 8);
    }
  }
  pcVar7 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar4
            );
  uVar5 = (ulong)(int)uVar6;
  lVar2 = *(long *)(pcVar7 + 8);
  uVar4 = (*(long *)(pcVar7 + 0x10) - lVar2 >> 3) * -0x5555555555555555;
  uVar6 = uVar5;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    uVar6 = (ulong)extraout_EDX;
    lVar3 = *(long *)(lVar2 + uVar5 * 0x18);
    uVar4 = *(long *)(lVar2 + 8 + uVar5 * 0x18) - lVar3 >> 3;
    if (uVar6 < uVar4) {
      return (Fraction *)(lVar3 + uVar6 * 8);
    }
  }
  pcVar7 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar4
            );
  return (Fraction *)(ulong)*(uint *)pcVar7;
}

Assistant:

const Fraction& Matrix::At(int i, int j) const {
  return elements_.at(i).at(j);
}